

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeBodies
          (TIntermediate *this,TInfoSink *infoSink,TIntermSequence *globals,
          TIntermSequence *unitGlobals)

{
  pointer ppTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  undefined4 extraout_var_01;
  TString *t;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long *plVar4;
  undefined4 extraout_var_00;
  
  uVar6 = 0;
  while( true ) {
    ppTVar1 = (globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar7 = (ulong)uVar6;
    if (((long)ppTVar1 -
         (long)(globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U <= uVar7) break;
    for (uVar8 = 0;
        (ulong)uVar8 <
        ((long)(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U; uVar8 = uVar8 + 1) {
      iVar3 = (*(globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]->_vptr_TIntermNode[6])();
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      iVar3 = (*(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8]->_vptr_TIntermNode[6])();
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
      if ((((plVar4 != (long *)0x0) && (plVar5 != (long *)0x0)) && ((int)plVar4[0x17] == 5)) &&
         ((int)plVar5[0x17] == 5)) {
        __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*plVar4 + 0x1a8))(plVar4);
        __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*plVar5 + 0x1a8))(plVar5);
        bVar2 = std::operator==(__lhs,__rhs);
        if (bVar2) {
          error(this,infoSink,
                "Multiple function bodies in multiple compilation units for the same signature in the same stage:"
                ,EShLangCount);
          TInfoSinkBase::append(&infoSink->info,"    ");
          iVar3 = (*(globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7]->_vptr_TIntermNode[6])();
          t = (TString *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x1a8))
                        ((long *)CONCAT44(extraout_var_01,iVar3));
          TInfoSinkBase::append(&infoSink->info,t);
          TInfoSinkBase::append(&infoSink->info,"\n");
        }
      }
    }
    uVar6 = uVar6 + 1;
  }
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
  insert<__gnu_cxx::__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,void>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)globals,
             (const_iterator)(ppTVar1 + -1),
             (__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              )(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              )((unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -1));
  return;
}

Assistant:

void TIntermediate::mergeBodies(TInfoSink& infoSink, TIntermSequence& globals, const TIntermSequence& unitGlobals)
{
    // TODO: link-time performance: Processing in alphabetical order will be faster

    // Error check the global objects, not including the linker objects
    for (unsigned int child = 0; child < globals.size() - 1; ++child) {
        for (unsigned int unitChild = 0; unitChild < unitGlobals.size() - 1; ++unitChild) {
            TIntermAggregate* body = globals[child]->getAsAggregate();
            TIntermAggregate* unitBody = unitGlobals[unitChild]->getAsAggregate();
            if (body && unitBody && body->getOp() == EOpFunction && unitBody->getOp() == EOpFunction && body->getName() == unitBody->getName()) {
                error(infoSink, "Multiple function bodies in multiple compilation units for the same signature in the same stage:");
                infoSink.info << "    " << globals[child]->getAsAggregate()->getName() << "\n";
            }
        }
    }

    // Merge the global objects, just in front of the linker objects
    globals.insert(globals.end() - 1, unitGlobals.begin(), unitGlobals.end() - 1);
}